

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

void __thiscall
llm_graph_input_attn_kv_unified::set_input
          (llm_graph_input_attn_kv_unified *this,llama_ubatch *ubatch)

{
  pointer plVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ggml_tensor *pgVar7;
  llama_seq_id **pplVar8;
  llama_pos *plVar9;
  llama_kv_cache_unified *plVar10;
  pointer plVar11;
  llama_hparams *plVar12;
  llama_cparams *plVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char cVar17;
  int iVar18;
  int iVar19;
  ggml_tensor *pgVar20;
  _Base_ptr p_Var21;
  long lVar22;
  char *pcVar23;
  _Base_ptr p_Var24;
  ulong uVar25;
  void *pvVar26;
  undefined8 uVar27;
  ulong uVar28;
  long lVar29;
  void *pvVar30;
  _Base_ptr p_Var31;
  ulong uVar32;
  int iVar34;
  undefined1 auVar33 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  ulong local_88;
  long lVar39;
  
  pgVar7 = this->self_kq_mask;
  pgVar20 = this->self_kq_mask_swa;
  if (pgVar7 != (ggml_tensor *)0x0 || pgVar20 != (ggml_tensor *)0x0) {
    uVar2 = this->kv_self->n;
    uVar32 = (ulong)uVar2;
    uVar3 = ubatch->n_tokens;
    uVar4 = ubatch->n_seq_tokens;
    uVar5 = ubatch->n_seqs;
    if (pgVar7 == (ggml_tensor *)0x0) {
      pvVar30 = (void *)0x0;
    }
    else {
      cVar17 = ggml_backend_buffer_is_host(pgVar7->buffer);
      if (cVar17 == '\0') {
        pcVar23 = "ggml_backend_buffer_is_host(self_kq_mask->buffer)";
        uVar27 = 0x1ae;
        goto LAB_001ab617;
      }
      pgVar20 = this->self_kq_mask_swa;
      pvVar30 = this->self_kq_mask->data;
    }
    if (pgVar20 == (ggml_tensor *)0x0) {
      pvVar26 = (void *)0x0;
    }
    else {
      cVar17 = ggml_backend_buffer_is_host(pgVar20->buffer);
      if (cVar17 == '\0') {
        pcVar23 = "ggml_backend_buffer_is_host(self_kq_mask_swa->buffer)";
        uVar27 = 0x1b3;
LAB_001ab617:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,uVar27,"GGML_ASSERT(%s) failed",pcVar23);
      }
      pvVar26 = this->self_kq_mask_swa->data;
    }
    if ((ulong)uVar5 != 0) {
      pplVar8 = ubatch->seq_id;
      local_88 = 0;
      do {
        if (uVar4 != 0) {
          iVar34 = *pplVar8[local_88];
          lVar22 = local_88 * uVar4;
          plVar9 = ubatch->pos;
          plVar10 = this->kv_self;
          uVar25 = 0;
          do {
            if (uVar32 != 0) {
              uVar6 = plVar9[lVar22 + uVar25];
              plVar11 = (plVar10->cells).
                        super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl.
                        super__Vector_impl_data._M_start;
              plVar12 = this->hparams;
              plVar13 = this->cparams;
              lVar29 = (uVar25 + lVar22) * uVar32;
              uVar28 = 0;
              do {
                plVar1 = plVar11 + uVar28;
                p_Var24 = *(_Base_ptr *)((long)&plVar11[uVar28].seq_id._M_t._M_impl + 0x10);
                fVar35 = -INFINITY;
                if (p_Var24 != (_Base_ptr)0x0) {
                  p_Var31 = (_Base_ptr)((long)&plVar11[uVar28].seq_id._M_t._M_impl + 8);
                  p_Var21 = p_Var31;
                  do {
                    if (iVar34 <= (int)p_Var24[1]._M_color) {
                      p_Var21 = p_Var24;
                    }
                    p_Var24 = (&p_Var24->_M_left)[(int)p_Var24[1]._M_color < iVar34];
                  } while (p_Var24 != (_Base_ptr)0x0);
                  fVar35 = -INFINITY;
                  if ((((p_Var21 != p_Var31) &&
                       (fVar35 = -INFINITY, (int)p_Var21[1]._M_color <= iVar34)) &&
                      ((plVar13->causal_attn != true ||
                       (fVar35 = -INFINITY, plVar1->pos <= (int)uVar6)))) &&
                     (fVar35 = 0.0, plVar12->use_alibi == true)) {
                    iVar18 = plVar1->pos - uVar6;
                    iVar19 = -iVar18;
                    if (iVar18 < 1) {
                      iVar19 = iVar18;
                    }
                    fVar35 = (float)iVar19;
                  }
                }
                if (pvVar30 != (void *)0x0) {
                  *(float *)((long)pvVar30 + (uVar28 + lVar29) * 4) = fVar35;
                }
                if (pvVar26 != (void *)0x0) {
                  if (plVar12->n_attn_chunk == 0) {
                    if ((int)plVar12->n_swa <= (int)(uVar6 - plVar1->pos)) {
                      fVar35 = -INFINITY;
                    }
                  }
                  else {
                    iVar19 = uVar6 - uVar6 % plVar12->n_attn_chunk;
                    fVar36 = -INFINITY;
                    if (iVar19 <= (int)uVar6) {
                      fVar36 = fVar35;
                    }
                    fVar35 = -INFINITY;
                    if (iVar19 <= plVar1->pos) {
                      fVar35 = fVar36;
                    }
                  }
                  *(float *)((long)pvVar26 + (uVar28 + lVar29) * 4) = fVar35;
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar32);
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar4);
        }
        local_88 = local_88 + 1;
      } while (local_88 != uVar5);
    }
    auVar16 = _DAT_002350d0;
    auVar15 = _DAT_002350c0;
    auVar14 = _DAT_002350b0;
    if (pvVar30 != (void *)0x0) {
      lVar22 = (long)(int)uVar3;
      uVar25 = (ulong)uVar3 + 0x3f & 0x1ffffffc0;
      if (lVar22 < (long)uVar25) {
        lVar29 = uVar32 - 1;
        auVar33._8_4_ = (int)lVar29;
        auVar33._0_8_ = lVar29;
        auVar33._12_4_ = (int)((ulong)lVar29 >> 0x20);
        lVar29 = lVar22 * uVar32 * 4 + 0xc + (long)pvVar30;
        auVar33 = auVar33 ^ _DAT_002350d0;
        do {
          if (uVar32 != 0) {
            uVar28 = 0;
            auVar37 = auVar15;
            auVar40 = auVar14;
            do {
              auVar42 = auVar37 ^ auVar16;
              iVar34 = auVar33._4_4_;
              if ((bool)(~(auVar42._4_4_ == iVar34 && auVar33._0_4_ < auVar42._0_4_ ||
                          iVar34 < auVar42._4_4_) & 1)) {
                *(undefined4 *)(lVar29 + -0xc + uVar28 * 4) = 0xff800000;
              }
              if ((auVar42._12_4_ != auVar33._12_4_ || auVar42._8_4_ <= auVar33._8_4_) &&
                  auVar42._12_4_ <= auVar33._12_4_) {
                *(undefined4 *)(lVar29 + -8 + uVar28 * 4) = 0xff800000;
              }
              auVar42 = auVar40 ^ auVar16;
              iVar19 = auVar42._4_4_;
              if (iVar19 <= iVar34 && (iVar19 != iVar34 || auVar42._0_4_ <= auVar33._0_4_)) {
                *(undefined4 *)(lVar29 + -4 + uVar28 * 4) = 0xff800000;
                *(undefined4 *)(lVar29 + uVar28 * 4) = 0xff800000;
              }
              uVar28 = uVar28 + 4;
              lVar39 = auVar37._8_8_;
              auVar37._0_8_ = auVar37._0_8_ + 4;
              auVar37._8_8_ = lVar39 + 4;
              lVar39 = auVar40._8_8_;
              auVar40._0_8_ = auVar40._0_8_ + 4;
              auVar40._8_8_ = lVar39 + 4;
            } while ((uVar32 + 3 & 0x1fffffffc) != uVar28);
          }
          lVar22 = lVar22 + 1;
          lVar29 = lVar29 + uVar32 * 4;
        } while (lVar22 < (long)uVar25);
      }
    }
    auVar16 = _DAT_002350d0;
    auVar15 = _DAT_002350c0;
    auVar14 = _DAT_002350b0;
    if (pvVar26 != (void *)0x0) {
      uVar25 = (ulong)uVar3 + 0x3f & 0x1ffffffc0;
      lVar22 = (long)(int)uVar3;
      if (lVar22 < (long)uVar25) {
        lVar29 = uVar32 - 1;
        auVar42._8_4_ = (int)lVar29;
        auVar42._0_8_ = lVar29;
        auVar42._12_4_ = (int)((ulong)lVar29 >> 0x20);
        lVar29 = (long)pvVar26 + lVar22 * uVar32 * 4 + 0xc;
        auVar42 = auVar42 ^ _DAT_002350d0;
        do {
          if (uVar2 != 0) {
            uVar28 = 0;
            auVar38 = auVar15;
            auVar41 = auVar14;
            do {
              auVar33 = auVar38 ^ auVar16;
              iVar34 = auVar42._4_4_;
              if ((bool)(~(auVar33._4_4_ == iVar34 && auVar42._0_4_ < auVar33._0_4_ ||
                          iVar34 < auVar33._4_4_) & 1)) {
                *(undefined4 *)(lVar29 + -0xc + uVar28 * 4) = 0xff800000;
              }
              if ((auVar33._12_4_ != auVar42._12_4_ || auVar33._8_4_ <= auVar42._8_4_) &&
                  auVar33._12_4_ <= auVar42._12_4_) {
                *(undefined4 *)(lVar29 + -8 + uVar28 * 4) = 0xff800000;
              }
              auVar33 = auVar41 ^ auVar16;
              iVar19 = auVar33._4_4_;
              if (iVar19 <= iVar34 && (iVar19 != iVar34 || auVar33._0_4_ <= auVar42._0_4_)) {
                *(undefined4 *)(lVar29 + -4 + uVar28 * 4) = 0xff800000;
                *(undefined4 *)(lVar29 + uVar28 * 4) = 0xff800000;
              }
              uVar28 = uVar28 + 4;
              lVar39 = auVar38._8_8_;
              auVar38._0_8_ = auVar38._0_8_ + 4;
              auVar38._8_8_ = lVar39 + 4;
              lVar39 = auVar41._8_8_;
              auVar41._0_8_ = auVar41._0_8_ + 4;
              auVar41._8_8_ = lVar39 + 4;
            } while ((uVar32 + 3 & 0x1fffffffc) != uVar28);
          }
          lVar22 = lVar22 + 1;
          lVar29 = lVar29 + uVar32 * 4;
        } while (lVar22 < (long)uVar25);
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_attn_kv_unified::set_input(const llama_ubatch * ubatch) {
    if (self_kq_mask || self_kq_mask_swa) {
        const int64_t n_kv         = kv_self->n;
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        float * data     = nullptr;
        float * data_swa = nullptr;

        if (self_kq_mask) {
            GGML_ASSERT(ggml_backend_buffer_is_host(self_kq_mask->buffer));
            data = (float *) self_kq_mask->data;
        }

        if (self_kq_mask_swa) {
            GGML_ASSERT(ggml_backend_buffer_is_host(self_kq_mask_swa->buffer));
            data_swa = (float *) self_kq_mask_swa->data;
        }

        // Use only the previous KV cells of the correct sequence for each token of the ubatch.
        // It's assumed that if a token in the batch has multiple sequences, they are equivalent.
        // Example with a cache of 10 tokens, 2 tokens populated in cache and 3 tokens in batch:
        //   Causal mask:
        //      xxx-------
        //      xxxx------
        //      xxxxx-----
        //   Non-causal mask:
        //      xxxxx-----
        //      xxxxx-----
        //      xxxxx-----
        // To visualize the mask, see https://github.com/ggml-org/llama.cpp/pull/12615
        for (int h = 0; h < 1; ++h) {
            for (int s = 0; s < n_seqs; ++s) {
                const llama_seq_id seq_id = ubatch->seq_id[s][0];

                for (int j = 0; j < n_seq_tokens; ++j) {
                    const llama_pos pos = ubatch->pos[s*n_seq_tokens + j];
                    for (int i = 0; i < n_kv; ++i) {
                        float f;
                        // mask the token if:
                        if (!kv_self->cells[i].has_seq_id(seq_id) // not the correct sequence
                            || (cparams.causal_attn && kv_self->cells[i].pos > pos) // for causal, mask future tokens
                        ) {
                            f = -INFINITY;
                        } else {
                            if (hparams.use_alibi) {
                                f = -std::abs(kv_self->cells[i].pos - pos);
                            } else {
                                f = 0.0f;
                            }
                        }

                        if (data) {
                            data[h*(n_kv*n_tokens) + s*(n_kv*n_seq_tokens) + j*n_kv + i] = f;
                        }

                        // may need to cut off old tokens for sliding window
                        // TODO @ngxson : we are currently re-using the swa logic to store the chunked mask, we should rename SWA to something more generic like "aux mask"
                        if (data_swa) {
                            if (hparams.n_attn_chunk) {
                                llama_pos pos_chunk_start = (pos / hparams.n_attn_chunk) * hparams.n_attn_chunk;
                                if (kv_self->cells[i].pos < pos_chunk_start || pos < pos_chunk_start) {
                                    f = -INFINITY;
                                }
                            } else {
                                if (pos - kv_self->cells[i].pos >= (int32_t)hparams.n_swa) {
                                    f = -INFINITY;
                                }
                            }
                            data_swa[h*(n_kv*n_tokens) + s*(n_kv*n_seq_tokens) + j*n_kv + i] = f;
                        }
                    }
                }
            }

            // mask padded tokens
            if (data) {
                for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                    for (int j = 0; j < n_kv; ++j) {
                        data[h*(n_kv*n_tokens) + i*n_kv + j] = -INFINITY;
                    }
                }
            }

            // mask padded tokens
            if (data_swa) {
                for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                    for (int j = 0; j < n_kv; ++j) {
                        data_swa[h*(n_kv*n_tokens) + i*n_kv + j] = -INFINITY;
                    }
                }
            }
        }
    }
}